

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_color_sinks-inl.h
# Opt level: O1

shared_ptr<spdlog::logger> __thiscall
spdlog::stderr_color_mt<spdlog::synchronous_factory>
          (spdlog *this,string *logger_name,color_mode mode)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<spdlog::logger> sVar3;
  color_mode local_44;
  string local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  pcVar1 = (logger_name->_M_dataplus)._M_p;
  local_44 = mode;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + logger_name->_M_string_length);
  sVar3 = synchronous_factory::
          create<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,spdlog::color_mode&>
                    ((synchronous_factory *)this,&local_40,&local_44);
  _Var2 = sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<logger> stderr_color_mt(const std::string &logger_name,
                                                      color_mode mode) {
    return Factory::template create<sinks::stderr_color_sink_mt>(logger_name, mode);
}